

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

string * __thiscall
rcg::getEnum_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          char *name,bool exception)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  invalid_argument *piVar4;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [2];
  
  cVar1 = (char)name;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar3 = *(long **)this;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_80,(char *)nodemap);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,local_80);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_80);
  if (plVar3 == (long *)0x0) {
    if (cVar1 != '\0') {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not found: ",&local_a1);
      std::operator+(local_80,&local_a0,(char *)nodemap);
      std::invalid_argument::invalid_argument(piVar4,(string *)local_80);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if (iVar2 - 3U < 2) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      if (plVar3 == (long *)0x0) {
        if (cVar1 != '\0') {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_a0,"Feature not enumeration: ",&local_a1);
          std::operator+(local_80,&local_a0,(char *)nodemap);
          std::invalid_argument::invalid_argument(piVar4,(string *)local_80);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        plVar3 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3,0,0);
        if (plVar3 == (long *)0x0) {
          if (cVar1 != '\0') {
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_a0,"Current value is not defined: ",&local_a1);
            std::operator+(local_80,&local_a0,(char *)nodemap);
            std::invalid_argument::invalid_argument(piVar4,(string *)local_80);
            __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x40))(local_80,plVar3);
          GenICam_3_4::gcstring::operator_cast_to_char_((gcstring *)local_80);
          std::__cxx11::string::assign((char *)__return_storage_ptr__);
          GenICam_3_4::gcstring::~gcstring((gcstring *)local_80);
        }
      }
    }
    else if (cVar1 != '\0') {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not readable: ",&local_a1);
      std::operator+(local_80,&local_a0,(char *)nodemap);
      std::invalid_argument::invalid_argument(piVar4,(string *)local_80);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    bool exception)
{
  std::string ret;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::IEnumEntry *entry=val->GetCurrentEntry();

          if (entry != 0)
          {
            ret=entry->GetSymbolic();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Current value is not defined: ")+name);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}